

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanomsg_reader.cc
# Opt level: O0

void __thiscall NanomsgReader::NanomsgReader(NanomsgReader *this,string *addr)

{
  ostream *poVar1;
  char *pcVar2;
  runtime_error *prVar3;
  string *in_RSI;
  PacketReader *in_RDI;
  stringstream ss_3;
  stringstream ss_2;
  stringstream ss_1;
  int size;
  stringstream ss;
  int fd;
  int rv;
  undefined8 in_stack_fffffffffffff858;
  int protocol;
  int in_stack_fffffffffffff860;
  char *in_stack_fffffffffffff868;
  int in_stack_fffffffffffff870;
  undefined4 in_stack_fffffffffffff878;
  undefined4 in_stack_fffffffffffff87c;
  void *in_stack_fffffffffffff880;
  int in_stack_fffffffffffff888;
  int in_stack_fffffffffffff88c;
  int in_stack_fffffffffffff890;
  string local_6e0 [32];
  stringstream local_6c0 [16];
  ostream local_6b0 [383];
  undefined1 local_531;
  string local_530 [32];
  stringstream local_510 [16];
  ostream local_500 [383];
  undefined1 local_381;
  string local_380 [32];
  stringstream local_360 [16];
  ostream local_350 [376];
  undefined4 local_1d8;
  undefined1 local_1d1;
  string local_1d0 [32];
  stringstream local_1b0 [16];
  ostream local_1a0 [392];
  int local_18;
  int local_14;
  string *local_10;
  
  protocol = (int)((ulong)in_stack_fffffffffffff858 >> 0x20);
  local_10 = in_RSI;
  PacketReader::PacketReader(in_RDI);
  in_RDI->_vptr_PacketReader = (_func_int **)&PTR__NanomsgReader_001995b0;
  local_18 = nn_socket(in_stack_fffffffffffff860,protocol);
  if (local_18 < 0) {
    std::__cxx11::stringstream::stringstream(local_1b0);
    poVar1 = std::operator<<(local_1a0,"nn_socket: ");
    nn_errno();
    pcVar2 = nn_strerror(0);
    std::operator<<(poVar1,pcVar2);
    local_1d1 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    std::runtime_error::runtime_error(prVar3,local_1d0);
    local_1d1 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_1d8 = 0x1000000;
  local_14 = nn_setsockopt(in_stack_fffffffffffff890,in_stack_fffffffffffff88c,
                           in_stack_fffffffffffff888,in_stack_fffffffffffff880,
                           CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
  if (local_14 < 0) {
    nn_close(in_stack_fffffffffffff870);
    std::__cxx11::stringstream::stringstream(local_360);
    poVar1 = std::operator<<(local_350,"nn_setsockopt: ");
    nn_errno();
    pcVar2 = nn_strerror(0);
    std::operator<<(poVar1,pcVar2);
    local_381 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    std::runtime_error::runtime_error(prVar3,local_380);
    local_381 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::c_str();
  local_14 = nn_connect(in_stack_fffffffffffff870,in_stack_fffffffffffff868);
  if (local_14 < 0) {
    nn_close(in_stack_fffffffffffff870);
    std::__cxx11::stringstream::stringstream(local_510);
    poVar1 = std::operator<<(local_500,"nn_connect: ");
    nn_errno();
    pcVar2 = nn_strerror(0);
    std::operator<<(poVar1,pcVar2);
    poVar1 = std::operator<<(local_500," (");
    poVar1 = std::operator<<(poVar1,local_10);
    std::operator<<(poVar1,")");
    local_531 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    std::runtime_error::runtime_error(prVar3,local_530);
    local_531 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_14 = nn_setsockopt(in_stack_fffffffffffff890,in_stack_fffffffffffff88c,
                           in_stack_fffffffffffff888,in_stack_fffffffffffff880,
                           CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
  if (local_14 < 0) {
    nn_close(in_stack_fffffffffffff870);
    std::__cxx11::stringstream::stringstream(local_6c0);
    poVar1 = std::operator<<(local_6b0,"nn_setsockopt: ");
    nn_errno();
    pcVar2 = nn_strerror(0);
    std::operator<<(poVar1,pcVar2);
    poVar1 = std::operator<<(local_6b0," (");
    poVar1 = std::operator<<(poVar1,local_10);
    std::operator<<(poVar1,")");
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    std::runtime_error::runtime_error(prVar3,local_6e0);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  *(int *)&in_RDI[1]._vptr_PacketReader = local_18;
  return;
}

Assistant:

NanomsgReader::NanomsgReader(const std::string& addr) {
  int rv;

  auto fd = nn_socket(AF_SP, NN_SUB);
  if (fd < 0) {
    std::stringstream ss;
    ss << "nn_socket: " << nn_strerror(nn_errno());
    throw std::runtime_error(ss.str());
  }

  // Fix receive buffer size to "plenty".
  // HRIT packet stream is 50KB/sec so this gives us 5+ minutes
  // before the buffer is full and nanomsg starts dropping messages.
  int size = 16 * 1024 * 1024;
  rv = nn_setsockopt(fd, NN_SOL_SOCKET, NN_RCVBUF, &size, sizeof(size));
  if (rv < 0) {
    nn_close(fd);
    std::stringstream ss;
    ss << "nn_setsockopt: " << nn_strerror(nn_errno());
    throw std::runtime_error(ss.str());
  }

  rv = nn_connect(fd, addr.c_str());
  if (rv < 0) {
    nn_close(fd);
    std::stringstream ss;
    ss << "nn_connect: " << nn_strerror(nn_errno());
    ss << " (" << addr << ")";
    throw std::runtime_error(ss.str());
  }

  rv = nn_setsockopt(fd, NN_SUB, NN_SUB_SUBSCRIBE, "", 0);
  if (rv < 0) {
    nn_close(fd);
    std::stringstream ss;
    ss << "nn_setsockopt: " << nn_strerror(nn_errno());
    ss << " (" << addr << ")";
    throw std::runtime_error(ss.str());
  }

  fd_ = fd;
}